

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileline.c
# Opt level: O1

int fileline_initialize(backtrace_state *state,backtrace_error_callback error_callback,void *data)

{
  bool bVar1;
  backtrace_state *pbVar2;
  bool bVar3;
  int descriptor;
  __pid_t _Var4;
  int iVar5;
  char *pcVar6;
  char local_98 [8];
  char buf [64];
  fileline fileline_fn;
  backtrace_state *pbStack_48;
  int does_not_exist;
  backtrace_error_callback local_40;
  void *local_38;
  
  local_40 = error_callback;
  local_38 = data;
  if (state->threaded == 0) {
    if (state->fileline_initialization_failed == 0) {
      if (state->fileline_fn != (fileline)0x0) {
        return 1;
      }
      descriptor = -1;
      bVar1 = false;
      buf[0x38] = '\0';
      buf[0x39] = '\0';
      buf[0x3a] = '\0';
      buf[0x3b] = '\0';
      buf[0x3c] = '\0';
      buf[0x3d] = '\0';
      buf[0x3e] = '\0';
      buf[0x3f] = '\0';
      iVar5 = 0;
      pbStack_48 = state;
      do {
        switch(iVar5) {
        case 0:
          pcVar6 = pbStack_48->filename;
          break;
        case 1:
        case 2:
        case 6:
        case 7:
        case 8:
        case 9:
          pcVar6 = (char *)0x0;
          break;
        case 3:
          pcVar6 = "/proc/self/exe";
          break;
        case 4:
          pcVar6 = "/proc/curproc/file";
          break;
        case 5:
          _Var4 = getpid();
          pcVar6 = local_98;
          snprintf(pcVar6,0x40,"/proc/%ld/object/a.out",(long)_Var4);
          break;
        default:
          goto switchD_00122c77_default;
        }
        if (pcVar6 == (char *)0x0) {
          bVar3 = false;
        }
        else {
          descriptor = tcmalloc_backtrace_open
                                 (pcVar6,local_40,local_38,(int *)((long)&fileline_fn + 4));
          bVar3 = true;
          if (fileline_fn._4_4_ != 0) {
            bVar3 = bVar1;
          }
          if (-1 >= descriptor) {
            bVar1 = bVar3;
          }
          bVar3 = -1 < descriptor || fileline_fn._4_4_ == 0;
        }
        pbVar2 = pbStack_48;
      } while ((!bVar3) && (bVar3 = iVar5 != 9, iVar5 = iVar5 + 1, bVar3));
      if (descriptor < 0) {
        if (!bVar1) {
          pcVar6 = pbStack_48->filename;
          if (pcVar6 == (char *)0x0) {
            pcVar6 = "libbacktrace could not find executable to open";
            iVar5 = 0;
          }
          else {
            iVar5 = 2;
          }
          (*local_40)(local_38,pcVar6,iVar5);
        }
      }
      else {
        iVar5 = tcmalloc_backtrace_initialize
                          (pbStack_48,pcVar6,descriptor,local_40,local_38,(fileline *)(buf + 0x38));
        if (iVar5 != 0) {
          if (pbVar2->threaded == 0) {
            pbVar2->fileline_fn = (fileline)buf._56_8_;
            return 1;
          }
          goto switchD_00122c77_default;
        }
      }
      if (pbVar2->threaded != 0) goto switchD_00122c77_default;
      pbVar2->fileline_initialization_failed = 1;
    }
    else {
      (*error_callback)(data,"failed to read executable information",-1);
    }
    return 0;
  }
switchD_00122c77_default:
  abort();
}

Assistant:

static int
fileline_initialize (struct backtrace_state *state,
		     backtrace_error_callback error_callback, void *data)
{
  int failed;
  fileline fileline_fn;
  int pass;
  int called_error_callback;
  int descriptor;
  const char *filename;
  char buf[FILENAME_BUF_SIZE];

  if (!state->threaded)
    failed = state->fileline_initialization_failed;
  else
    failed = backtrace_atomic_load_int (&state->fileline_initialization_failed);

  if (failed)
    {
      error_callback (data, "failed to read executable information", -1);
      return 0;
    }

  if (!state->threaded)
    fileline_fn = state->fileline_fn;
  else
    fileline_fn = backtrace_atomic_load_pointer (&state->fileline_fn);
  if (fileline_fn != NULL)
    return 1;

  /* We have not initialized the information.  Do it now.  */

  descriptor = -1;
  called_error_callback = 0;
  for (pass = 0; pass < 10; ++pass)
    {
      int does_not_exist;

      switch (pass)
	{
	case 0:
	  filename = state->filename;
	  break;
	case 1:
	  filename = getexecname ();
	  break;
	case 2:
	  /* Test this before /proc/self/exe, as the latter exists but points
	     to the wine binary (and thus doesn't work).  */
	  filename = windows_executable_filename ();
	  break;
	case 3:
	  filename = "/proc/self/exe";
	  break;
	case 4:
	  filename = "/proc/curproc/file";
	  break;
	case 5:
	  snprintf (buf, sizeof (buf), "/proc/%ld/object/a.out",
		    (long) getpid ());
	  filename = buf;
	  break;
	case 6:
	  filename = sysctl_exec_name1 (state, error_callback, data);
	  break;
	case 7:
	  filename = sysctl_exec_name2 (state, error_callback, data);
	  break;
	case 8:
	  filename = macho_get_executable_path (state, error_callback, data);
	  break;
	case 9:
	  filename = windows_get_executable_path (buf, error_callback, data);
	  break;
	default:
	  abort ();
	}

      if (filename == NULL)
	continue;

      descriptor = backtrace_open (filename, error_callback, data,
				   &does_not_exist);
      if (descriptor < 0 && !does_not_exist)
	{
	  called_error_callback = 1;
	  break;
	}
      if (descriptor >= 0)
	break;
    }

  if (descriptor < 0)
    {
      if (!called_error_callback)
	{
	  if (state->filename != NULL)
	    error_callback (data, state->filename, ENOENT);
	  else
	    error_callback (data,
			    "libbacktrace could not find executable to open",
			    0);
	}
      failed = 1;
    }

  if (!failed)
    {
      if (!backtrace_initialize (state, filename, descriptor, error_callback,
				 data, &fileline_fn))
	failed = 1;
    }

  if (failed)
    {
      if (!state->threaded)
	state->fileline_initialization_failed = 1;
      else
	backtrace_atomic_store_int (&state->fileline_initialization_failed, 1);
      return 0;
    }

  if (!state->threaded)
    state->fileline_fn = fileline_fn;
  else
    {
      backtrace_atomic_store_pointer (&state->fileline_fn, fileline_fn);

      /* Note that if two threads initialize at once, one of the data
	 sets may be leaked.  */
    }

  return 1;
}